

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlUnloadRenderBatch(RenderBatch batch)

{
  long lVar1;
  int in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  
  if (RLGL.ExtSupported.vao) {
    (*glad_glBindVertexArray)(0);
  }
  (*glad_glDisableVertexAttribArray)(0);
  (*glad_glDisableVertexAttribArray)(1);
  (*glad_glDisableVertexAttribArray)(2);
  (*glad_glDisableVertexAttribArray)(3);
  (*glad_glBindBuffer)(0x8892,0);
  (*glad_glBindBuffer)(0x8893,0);
  if (0 < (long)in_stack_00000008) {
    lVar1 = 0;
    do {
      (*glad_glDeleteBuffers)(1,(GLuint *)((long)in_stack_00000010 + lVar1 + 0x34));
      (*glad_glDeleteBuffers)(1,(GLuint *)((long)in_stack_00000010 + lVar1 + 0x38));
      (*glad_glDeleteBuffers)(1,(GLuint *)((long)in_stack_00000010 + lVar1 + 0x3c));
      (*glad_glDeleteBuffers)(1,(GLuint *)((long)in_stack_00000010 + lVar1 + 0x40));
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glDeleteVertexArrays)(1,(GLuint *)((long)in_stack_00000010 + lVar1 + 0x30));
      }
      free(*(void **)((long)in_stack_00000010 + lVar1 + 0x10));
      free(*(void **)((long)in_stack_00000010 + lVar1 + 0x18));
      free(*(void **)((long)in_stack_00000010 + lVar1 + 0x20));
      free(*(void **)((long)in_stack_00000010 + lVar1 + 0x28));
      lVar1 = lVar1 + 0x48;
    } while ((long)in_stack_00000008 * 0x48 != lVar1);
  }
  free(in_stack_00000010);
  free(in_stack_00000018);
  return;
}

Assistant:

void rlUnloadRenderBatch(RenderBatch batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Unbind everything
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    glDisableVertexAttribArray(0);
    glDisableVertexAttribArray(1);
    glDisableVertexAttribArray(2);
    glDisableVertexAttribArray(3);
    glBindBuffer(GL_ARRAY_BUFFER, 0);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

    // Unload all vertex buffers data
    for (int i = 0; i < batch.buffersCount; i++)
    {
        // Delete VBOs from GPU (VRAM)
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[3]);

        // Delete VAOs from GPU (VRAM)
        if (RLGL.ExtSupported.vao) glDeleteVertexArrays(1, &batch.vertexBuffer[i].vaoId);

        // Free vertex arrays memory from CPU (RAM)
        RL_FREE(batch.vertexBuffer[i].vertices);
        RL_FREE(batch.vertexBuffer[i].texcoords);
        RL_FREE(batch.vertexBuffer[i].colors);
        RL_FREE(batch.vertexBuffer[i].indices);
    }

    // Unload arrays
    RL_FREE(batch.vertexBuffer);
    RL_FREE(batch.draws);
#endif
}